

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ext_delegated_credential_parse_clienthello
               (SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  CBS sigalg_list;
  CBS CStack_28;
  
  bVar1 = true;
  if (contents != (CBS *)0x0) {
    uVar2 = ssl_protocol_version(hs->ssl);
    if (0x303 < uVar2) {
      iVar3 = CBS_get_u16_length_prefixed(contents,&CStack_28);
      bVar1 = false;
      if ((iVar3 != 0) && (bVar1 = false, CStack_28.len != 0)) {
        if (contents->len == 0) {
          bVar1 = parse_u16_array(&CStack_28,&hs->peer_delegated_credential_sigalgs);
        }
        else {
          bVar1 = false;
        }
      }
    }
  }
  return bVar1;
}

Assistant:

static bool ext_delegated_credential_parse_clienthello(SSL_HANDSHAKE *hs,
                                                       uint8_t *out_alert,
                                                       CBS *contents) {
  if (contents == nullptr || ssl_protocol_version(hs->ssl) < TLS1_3_VERSION) {
    // Don't use delegated credentials unless we're negotiating TLS 1.3 or
    // higher.
    return true;
  }

  // The contents of the extension are the signature algorithms the client will
  // accept for a delegated credential.
  CBS sigalg_list;
  if (!CBS_get_u16_length_prefixed(contents, &sigalg_list) ||  //
      CBS_len(&sigalg_list) == 0 ||                            //
      CBS_len(contents) != 0 ||                                //
      !parse_u16_array(&sigalg_list, &hs->peer_delegated_credential_sigalgs)) {
    return false;
  }

  return true;
}